

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

UniquePtr<SSL_HANDSHAKE> __thiscall bssl::ssl_handshake_new(bssl *this,SSL *ssl)

{
  bool bVar1;
  pointer pSVar2;
  pointer pSVar3;
  unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> local_20;
  UniquePtr<SSL_HANDSHAKE> hs;
  SSL *ssl_local;
  
  hs._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl =
       (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)ssl;
  MakeUnique<bssl::SSL_HANDSHAKE,ssl_st*&>((bssl *)&local_20,(ssl_st **)&hs);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    pSVar2 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&local_20);
    bVar1 = SSLTranscript::Init(&pSVar2->transcript);
    if (bVar1) {
      pSVar3 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::get
                         ((unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)
                          ((long)hs._M_t.
                                 super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl +
                          8));
      pSVar2 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&local_20);
      pSVar2->config = pSVar3;
      pSVar2 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&local_20);
      if (pSVar2->config == (SSL_CONFIG *)0x0) {
        pSVar2 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                           (&local_20);
        if (pSVar2->config == (SSL_CONFIG *)0x0) {
          __assert_fail("hs->config",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                        ,0x6a,"UniquePtr<SSL_HANDSHAKE> bssl::ssl_handshake_new(SSL *)");
        }
        std::unique_ptr<bssl::SSL_HANDSHAKE,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bssl::SSL_HANDSHAKE,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
      }
      else {
        std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)this,&local_20);
      }
      goto LAB_0017f75d;
    }
  }
  std::unique_ptr<bssl::SSL_HANDSHAKE,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bssl::SSL_HANDSHAKE,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
LAB_0017f75d:
  std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_HANDSHAKE> ssl_handshake_new(SSL *ssl) {
  UniquePtr<SSL_HANDSHAKE> hs = MakeUnique<SSL_HANDSHAKE>(ssl);
  if (!hs || !hs->transcript.Init()) {
    return nullptr;
  }
  hs->config = ssl->config.get();
  if (!hs->config) {
    assert(hs->config);
    return nullptr;
  }
  return hs;
}